

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

int anon_unknown.dwarf_4bf6b6::cmFileCommandCurlDebugCallback
              (CURL *param_1,curl_infotype type,char *chPtr,size_t size,void *data)

{
  int iVar1;
  char local_b8 [4];
  int n;
  char buf [128];
  cmFileCommandVectorOfChar *vec;
  void *data_local;
  size_t size_local;
  char *chPtr_local;
  curl_infotype type_local;
  CURL *param_0_local;
  
  buf._120_8_ = data;
  if (type < CURLINFO_DATA_IN) {
    ::cm::append<std::vector<char,_std::allocator<char>_>,_char_*,_0>
              ((vector<char,_std::allocator<char>_> *)data,chPtr,chPtr + size);
  }
  else if ((type - CURLINFO_DATA_IN < 4) &&
          (iVar1 = snprintf(local_b8,0x80,"[%lu bytes data]\n",size), 0 < iVar1)) {
    ::cm::append<std::vector<char,_std::allocator<char>_>,_char_*,_0>
              ((vector<char,_std::allocator<char>_> *)buf._120_8_,local_b8,local_b8 + iVar1);
  }
  return 0;
}

Assistant:

int cmFileCommandCurlDebugCallback(CURL*, curl_infotype type, char* chPtr,
                                   size_t size, void* data)
{
  cmFileCommandVectorOfChar& vec =
    *static_cast<cmFileCommandVectorOfChar*>(data);
  switch (type) {
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
    case CURLINFO_HEADER_OUT:
      cm::append(vec, chPtr, chPtr + size);
      break;
    case CURLINFO_DATA_IN:
    case CURLINFO_DATA_OUT:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT: {
      char buf[128];
      int n =
        snprintf(buf, sizeof(buf), "[%" KWIML_INT_PRIu64 " bytes data]\n",
                 static_cast<KWIML_INT_uint64_t>(size));
      if (n > 0) {
        cm::append(vec, buf, buf + n);
      }
    } break;
    default:
      break;
  }
  return 0;
}